

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O0

void Acb_ObjRemoveDup(Acb_Ntk_t *p,int iObj,int i,int j)

{
  int iVar1;
  int iVar2;
  word wVar3;
  word wVar4;
  Vec_Int_t *p_00;
  word uTruth;
  word uTruthNew;
  word c11;
  word c00;
  int j_local;
  int i_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  wVar3 = Acb_ObjTruth(p,iObj);
  iVar1 = Acb_ObjIsCio(p,iObj);
  if (iVar1 != 0) {
    __assert_fail("!Acb_ObjIsCio(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbPush.c"
                  ,0xad,"void Acb_ObjRemoveDup(Acb_Ntk_t *, int, int, int)");
  }
  iVar1 = Acb_ObjFanin(p,iObj,i);
  iVar2 = Acb_ObjFanin(p,iObj,j);
  if (iVar1 == iVar2) {
    wVar4 = Abc_Tt6Cofactor0(wVar3,i);
    wVar4 = Abc_Tt6Cofactor0(wVar4,j);
    wVar3 = Abc_Tt6Cofactor1(wVar3,i);
    wVar3 = Abc_Tt6Cofactor1(wVar3,j);
    wVar3 = Abc_Tt6RemoveVar((s_Truths6[i] ^ 0xffffffffffffffff) & wVar4 | s_Truths6[i] & wVar3,j);
    Vec_WrdWriteEntry(&p->vObjTruth,iObj,wVar3);
    Acb_ObjDeleteFaninIndex(p,iObj,j);
    p_00 = Vec_WecEntry(&p->vFanouts,iObj);
    iVar1 = Acb_ObjFanin(p,iObj,j);
    Vec_IntRemove(p_00,iVar1);
    Acb_ObjSuppMin(p,iObj);
    return;
  }
  __assert_fail("Acb_ObjFanin(p, iObj, i) == Acb_ObjFanin(p, iObj, j)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbPush.c"
                ,0xae,"void Acb_ObjRemoveDup(Acb_Ntk_t *, int, int, int)");
}

Assistant:

void Acb_ObjRemoveDup( Acb_Ntk_t * p, int iObj, int i, int j )
{
    word c00, c11, uTruthNew, uTruth = Acb_ObjTruth( p, iObj );
    assert( !Acb_ObjIsCio(p, iObj) );
    assert( Acb_ObjFanin(p, iObj, i) == Acb_ObjFanin(p, iObj, j) );
    c00 = Abc_Tt6Cofactor0( Abc_Tt6Cofactor0(uTruth, i), j );
    c11 = Abc_Tt6Cofactor1( Abc_Tt6Cofactor1(uTruth, i), j );
    uTruthNew = (~s_Truths6[i] & c00) | (s_Truths6[i] & c11);
    Vec_WrdWriteEntry( &p->vObjTruth, iObj, Abc_Tt6RemoveVar(uTruthNew, j) );
    Acb_ObjDeleteFaninIndex( p, iObj, j );
    Vec_IntRemove( Vec_WecEntry(&p->vFanouts, iObj), Acb_ObjFanin(p, iObj, j) );
    Acb_ObjSuppMin( p, iObj );
}